

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestGroupNames(TestRegistry *this,TestResult *result)

{
  byte bVar1;
  char *pcVar2;
  long *in_RSI;
  long in_RDI;
  SimpleString gname;
  UtestShell *test;
  SimpleString groupList;
  UtestShell *in_stack_ffffffffffffff48;
  SimpleString *in_stack_ffffffffffffff50;
  SimpleString *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  SimpleString *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  SimpleString *local_28;
  
  SimpleString::SimpleString(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  local_28 = *(SimpleString **)(in_RDI + 8);
  while (local_28 != (SimpleString *)0x0) {
    SimpleString::SimpleString(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    SimpleString::operator+=
              (in_stack_ffffffffffffff70,
               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    UtestShell::getGroup(in_stack_ffffffffffffff48);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x1736e6);
    SimpleString::operator+=
              (in_stack_ffffffffffffff70,
               (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff7f =
         SimpleString::contains(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48)
    ;
    if (!(bool)in_stack_ffffffffffffff7f) {
      SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
      SimpleString::operator+=
                (in_stack_ffffffffffffff70,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    }
    SimpleString::~SimpleString((SimpleString *)0x17379a);
    in_stack_ffffffffffffff70 = (SimpleString *)(**(code **)(local_28->buffer_ + 0x18))();
    local_28 = in_stack_ffffffffffffff70;
  }
  SimpleString::replace
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SimpleString::SimpleString(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  bVar1 = SimpleString::endsWith
                    ((SimpleString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60);
  SimpleString::~SimpleString((SimpleString *)0x173828);
  if ((bVar1 & 1) != 0) {
    SimpleString::size((SimpleString *)0x173842);
    SimpleString::subString
              ((SimpleString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
               (size_t)in_stack_ffffffffffffff70,CONCAT17(bVar1,in_stack_ffffffffffffff68));
    SimpleString::operator=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x173887);
  }
  pcVar2 = SimpleString::asCharString((SimpleString *)0x1738d7);
  (**(code **)(*in_RSI + 0x70))(in_RSI,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x173900);
  return;
}

Assistant:

void TestRegistry::listTestGroupNames(TestResult& result)
{
    SimpleString groupList;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        SimpleString gname;
        gname += "#";
        gname += test->getGroup();
        gname += "#";

        if (!groupList.contains(gname)) {
            groupList += gname;
            groupList += " ";
        }
    }

    groupList.replace("#", "");

    if (groupList.endsWith(" "))
        groupList = groupList.subString(0, groupList.size() - 1);
    result.print(groupList.asCharString());
}